

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O2

void __thiscall
xray_re::xr_writer::
w_seq<std::vector<xray_re::_svector<xray_re::lw_vmref_entry,5u>,std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,5u>>>,write_vmref>
          (xr_writer *this,undefined8 *container)

{
  lw_vmref *plVar1;
  lw_vmref *ref;
  write_vmref local_21;
  
  plVar1 = (lw_vmref *)container[1];
  for (ref = (lw_vmref *)*container; ref != plVar1; ref = ref + 1) {
    write_vmref::operator()(&local_21,ref,this);
  }
  return;
}

Assistant:

inline void xr_writer::w_seq(const T& container, F write)
{
	for (typename T::const_iterator it = container.begin(),
			end = container.end(); it != end; ++it) {
		write(*it, *this);
	}
}